

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O0

void Amap_ManMergeNodeChoice(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  int local_2c;
  Amap_Cut_t *pAStack_28;
  int c;
  Amap_Cut_t *pCut;
  Amap_Obj_t *pTemp;
  Amap_Obj_t *pNode_local;
  Amap_Man_t *p_local;
  
  for (pCut = (Amap_Cut_t *)pNode; pCut != (Amap_Cut_t *)0x0;
      pCut = (Amap_Cut_t *)Amap_ObjChoice(p,(Amap_Obj_t *)pCut)) {
    local_2c = 0;
    for (pAStack_28 = *(Amap_Cut_t **)(pCut + 8);
        (local_2c < (int)((uint)pCut[2] >> 0xc) && (pAStack_28 != (Amap_Cut_t *)0x0));
        pAStack_28 = Amap_ManCutNext(pAStack_28)) {
      if (((uint)*pAStack_28 & 0xffff) != 0) {
        Amap_ManCutStore(p,pAStack_28,
                         (uint)((ulong)*(undefined8 *)pNode >> 0x3d) & 1 ^
                         (uint)((ulong)*(undefined8 *)pCut >> 0x3d) & 1);
      }
      local_2c = local_2c + 1;
    }
    *(undefined8 *)(pCut + 8) = 0;
  }
  Amap_ManCutSaveStored(p,pNode);
  return;
}

Assistant:

void Amap_ManMergeNodeChoice( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    Amap_Obj_t * pTemp;
    Amap_Cut_t * pCut;
    int c;
    // go through the nodes of the choice node
    for ( pTemp = pNode; pTemp; pTemp = Amap_ObjChoice(p, pTemp) )
    {
        Amap_NodeForEachCut( pTemp, pCut, c )
        {
            if (!pCut) break;   // mikelee added; abort when pCut is NULL
            if ( pCut->iMat )
                Amap_ManCutStore( p, pCut, pNode->fPhase ^ pTemp->fPhase );
        }
        pTemp->pData = NULL;
    }
    Amap_ManCutSaveStored( p, pNode );

//    Amap_ManPrintCuts( pNode );
}